

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

double __thiscall
HighsLpRelaxation::computeBestEstimate(HighsLpRelaxation *this,HighsPseudocost *ps)

{
  pointer ppVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  long lVar3;
  long lVar4;
  const_iterator __begin2;
  pointer ppVar5;
  const_iterator __end2;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double offset;
  
  dVar11 = this->objective;
  ppVar5 = (this->fractionalints).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->fractionalints).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 == ppVar1) {
    dVar9 = 0.0;
  }
  else {
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar9 = 1.0;
    if (1.0 <= ABS(dVar11)) {
      dVar9 = ABS(dVar11);
    }
    lVar3 = (long)*(pointer *)((long)&(_Var2._M_head_impl)->integral_cols + 8) -
            *(long *)&((_Var2._M_head_impl)->integral_cols).
                      super__Vector_base<int,_std::allocator<int>_>;
    lVar4 = lVar3 >> 2;
    auVar10._8_4_ = (int)(lVar3 >> 0x22);
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = 0x45300000;
    offset = (dVar9 * (_Var2._M_head_impl)->feastol) /
             ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    dVar8 = 0.0;
    dVar9 = 0.0;
    do {
      dVar6 = HighsPseudocost::getPseudocostUp(ps,ppVar5->first,ppVar5->second,offset);
      dVar7 = HighsPseudocost::getPseudocostDown(ps,ppVar5->first,ppVar5->second,offset);
      if (dVar6 <= dVar7) {
        dVar7 = dVar6;
      }
      dVar6 = dVar9 + dVar7;
      dVar8 = dVar8 + (dVar9 - (dVar6 - dVar7)) + (dVar7 - (dVar6 - (dVar6 - dVar7)));
      ppVar5 = ppVar5 + 1;
      dVar9 = dVar6;
    } while (ppVar5 != ppVar1);
    dVar6 = dVar6 + dVar8;
    dVar8 = dVar11 + dVar6;
    dVar9 = (dVar11 - (dVar8 - dVar6)) + (dVar6 - (dVar8 - (dVar8 - dVar6))) + 0.0;
    dVar11 = dVar8;
  }
  return dVar11 + dVar9;
}

Assistant:

double HighsLpRelaxation::computeBestEstimate(const HighsPseudocost& ps) const {
  HighsCDouble estimate = objective;

  if (!fractionalints.empty()) {
    // because the pseudocost may be zero, we add an offset to the pseudocost so
    // that we always have some part of the estimate depending on the
    // fractionality.

    HighsCDouble increase = 0.0;
    double offset =
        mipsolver.mipdata_->feastol * std::max(std::abs(objective), 1.0) /
        static_cast<double>(mipsolver.mipdata_->integral_cols.size());

    for (const std::pair<HighsInt, double>& f : fractionalints) {
      increase += std::min(ps.getPseudocostUp(f.first, f.second, offset),
                           ps.getPseudocostDown(f.first, f.second, offset));
    }

    estimate += double(increase);
  }

  return double(estimate);
}